

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_history.c
# Opt level: O0

void fsg_history_set_fsg(fsg_history_t *h,fsg_model_t *fsg,dict_t *dict)

{
  glist_t **pppgVar1;
  dict_t *dict_local;
  fsg_model_t *fsg_local;
  fsg_history_t *h_local;
  
  if (h->entries->n_valid != 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
            ,0x72,"Switching FSG while history not empty; history cleared\n");
    blkarray_list_reset(h->entries);
  }
  if (h->frame_entries != (glist_t **)0x0) {
    ckd_free_2d(h->frame_entries);
  }
  h->frame_entries = (glist_t **)0x0;
  h->fsg = fsg;
  if ((fsg != (fsg_model_t *)0x0) && (dict != (dict_t *)0x0)) {
    h->n_ciphone = dict->mdef->n_ciphone;
    pppgVar1 = (glist_t **)
               __ckd_calloc_2d__((long)fsg->n_state,(long)dict->mdef->n_ciphone,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                                 ,0x80);
    h->frame_entries = pppgVar1;
  }
  return;
}

Assistant:

void
fsg_history_set_fsg(fsg_history_t *h, fsg_model_t *fsg, dict_t *dict)
{
    if (blkarray_list_n_valid(h->entries) != 0) {
        E_WARN("Switching FSG while history not empty; history cleared\n");
        blkarray_list_reset(h->entries);
    }

    if (h->frame_entries)
        ckd_free_2d((void **) h->frame_entries);
    h->frame_entries = NULL;
    h->fsg = fsg;

    if (fsg && dict) {
        h->n_ciphone = bin_mdef_n_ciphone(dict->mdef);
        h->frame_entries =
            (glist_t **) ckd_calloc_2d(fsg_model_n_state(fsg),
                                       bin_mdef_n_ciphone(dict->mdef),
                                       sizeof(glist_t));
    }
}